

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O1

void __thiscall
google::protobuf::DynamicMessage::DynamicMessage
          (DynamicMessage *this,TypeInfo *type_info,bool lock_factory)

{
  (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = (void *)0x0;
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DynamicMessage_003c6910;
  this->type_info_ = type_info;
  this->arena_ = (Arena *)0x0;
  (this->cached_byte_size_).super___atomic_base<int>._M_i = 0;
  type_info->prototype = this;
  SharedCtor(this,lock_factory);
  return;
}

Assistant:

DynamicMessage::DynamicMessage(TypeInfo* type_info, bool lock_factory)
    : type_info_(type_info), arena_(NULL), cached_byte_size_(0) {
  // The prototype in type_info has to be set before creating the prototype
  // instance on memory. e.g., message Foo { map<int32, Foo> a = 1; }. When
  // creating prototype for Foo, prototype of the map entry will also be
  // created, which needs the address of the prototype of Foo (the value in
  // map). To break the cyclic dependency, we have to assign the address of
  // prototype into type_info first.
  type_info->prototype = this;
  SharedCtor(lock_factory);
}